

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

atom * updateHydrogenInfo(FILE *outf,atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,
                         atomBins *bbins,int selectedFlag,int mustSaveMainWater)

{
  byte *pbVar1;
  long lVar2;
  residue_t *prVar3;
  FILE *__stream;
  byte bVar4;
  int iVar5;
  int iVar6;
  atom_t *paVar7;
  atom *paVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  atomBins *paVar12;
  atom_t *src;
  atom *paVar13;
  atom *paVar14;
  atom *paVar15;
  bool bVar16;
  bool bVar17;
  byte bVar18;
  float fVar19;
  double dVar20;
  double newlen;
  float fVar21;
  double dVar22;
  int dummy;
  atomBins *local_200;
  undefined4 local_1f8;
  uint local_1f4;
  atom *local_1f0;
  vector3d *local_1e8;
  atom *local_1e0;
  atom *local_1d8;
  undefined4 local_1cc;
  atom *local_1c8;
  FILE *local_1c0;
  atom *local_1b8;
  atom *local_1b0;
  ulong local_1a8;
  char *local_1a0;
  atomBins *local_198;
  point3d o2aVec;
  anon_struct_16_2_fa5d6e3e proximity [20];
  
  bVar18 = 0;
  dummy = 0;
  bVar16 = bbins != (atomBins *)0x0;
  paVar8 = allMovingAtoms;
  if (!bVar16) {
    paVar8 = (atom *)0x0;
  }
  bVar17 = allMovingAtoms != (atom *)0x0;
  if (bVar17) {
    allMovingAtoms = (atom *)bbins;
  }
  if (!bVar17 || !bVar16) {
    bbins = abins;
  }
  local_200 = abins;
  local_1c0 = (FILE *)outf;
  local_1b8 = allMovingAtoms;
  local_1b0 = allMainAtoms;
  local_198 = bbins;
  if (DumpNewHO == '\x01') {
    fwrite("@vectorlist {water H?} color= gray\n",0x23,1,(FILE *)outf);
  }
  local_1a8 = 0;
  local_1e0 = (atom *)0x0;
  local_1d8 = (atom *)0x0;
  paVar12 = local_200;
  local_1f4 = selectedFlag;
  local_1c8 = paVar8;
  do {
    iVar5 = (int)local_1a8;
    src = paVar8;
    if (iVar5 == 0) {
      src = local_1b0;
    }
    if (src != (atom *)0x0) {
      do {
        iVar6 = getAtno(src->elem);
        uVar9 = src->flags & selectedFlag;
        paVar13 = src;
        if (iVar6 == 1) {
          if (uVar9 == 0) {
            paVar7 = (atom *)0x0;
          }
          else {
            paVar7 = findTouchingAtoms(src,(atom *)0x0,paVar12,0.0,0,&dummy);
            if (bVar17 && bVar16) {
              paVar7 = findTouchingAtoms(src,paVar7,(atomBins *)local_1b8,0.0,0,&dummy);
            }
          }
          if (paVar7 != (atom *)0x0) {
            markBonds(src,paVar7,1,1);
            uVar9 = dotType(src,paVar7,(uint)ByNABaseColor);
            if ((uVar9 < 0xc) && ((0xb00U >> (uVar9 & 0x1f) & 1) != 0)) {
              if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
                updateHydrogenInfo_cold_2();
              }
              pbVar1 = (byte *)((long)&src->props + 2);
              *pbVar1 = *pbVar1 | 1;
              if (UsePolarH == '\0') {
                src->elem = 4;
                fVar19 = getRadius(4,0);
                src->radius = fVar19;
              }
              fVar19 = src->occ;
              fVar21 = -fVar19;
              if (-fVar19 <= fVar19) {
                fVar21 = fVar19;
              }
              if (((fVar21 < 0.25) || (80.0 <= src->bval)) && ((src->props & 0x400) != 0)) {
                src->elem = 1;
                src->radius = 0.0;
              }
              do {
                if ((paVar7->mark == 1) && (iVar6 = getAtno(paVar7->elem), iVar6 != 1)) {
                  fVar19 = src->occ;
                  fVar21 = -fVar19;
                  if (-fVar19 <= fVar19) {
                    fVar21 = fVar19;
                  }
                  if ((0.25 <= fVar21) && (src->bval <= 80.0 && src->bval != 80.0)) {
                    pbVar1 = (byte *)((long)&paVar7->props + 2);
                    *pbVar1 = *pbVar1 & 0xfe;
                  }
                }
                paVar7 = paVar7->scratch;
              } while (paVar7 != (atom_t *)0x0);
            }
          }
        }
        else if (uVar9 != 0) {
          if ((((uint)src->props >> 10 & 1) == 0) || (src->elem != 9)) {
            if ((uVar9 != 0) &&
               (((((uint)src->props >> 10 & 1) == 0 && ((uint)src->elem < 0xc)) &&
                ((0xb00U >> (src->elem & 0x1fU) & 1) != 0)))) {
              src->props = src->props & 0xfffefbff;
            }
          }
          else {
            if (((uint)src->props >> 0x10 & 1) != 0) {
              for (paVar7 = src->next; (paVar7 != (atom_t *)0x0 && (src->r == paVar7->r));
                  paVar7 = paVar7->next) {
                iVar6 = getAtno(paVar7->elem);
                if ((iVar6 == 1) && ((src->altConf == paVar7->altConf && (0.1 < paVar7->occ)))) {
                  pbVar1 = (byte *)((long)&src->props + 2);
                  *pbVar1 = *pbVar1 & 0xfe;
                }
              }
            }
            paVar12 = local_200;
            if ((src->props & 0x10000) != 0) {
              if ((iVar5 == 0 && (mustSaveMainWater != 0 && (bVar17 && bVar16))) &&
                 (paVar8 = (atom *)malloc(0x80), paVar8 != (atom *)0x0)) {
                paVar14 = src;
                paVar15 = paVar8;
                for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
                  paVar15->next = paVar14->next;
                  paVar14 = (atom *)((long)paVar14 + (ulong)bVar18 * -0x10 + 8);
                  paVar15 = (atom *)((long)paVar15 + (ulong)bVar18 * -0x10 + 8);
                }
                paVar8->next = local_1e0;
                local_1e0 = paVar8;
              }
              src->props = src->props & 0xeffcffffU | 0x10020000;
              paVar7 = findTouchingAtoms(src,(atom *)0x0,paVar12,0.25,0,&dummy);
              if (bVar17 && bVar16) {
                paVar7 = findTouchingAtoms(src,paVar7,(atomBins *)local_1b8,0.25,0,&dummy);
              }
              if (paVar7 == (atom *)0x0) {
                uVar9 = 0;
              }
              else {
                uVar9 = 0;
                do {
                  if ((paVar7->props & 0x20000) != 0) {
                    local_1e8 = (vector3d *)CONCAT44(local_1e8._4_4_,paVar7->radius + 2.0);
                    dVar20 = v3distance(&paVar7->loc,&src->loc);
                    fVar19 = (float)(dVar20 - (double)local_1e8._0_4_);
                    bVar4 = 1;
                    if ((0 < (int)uVar9 & *(byte *)((long)&paVar7->props + 2) >> 2) == 1) {
                      lVar10 = 0;
                      do {
                        lVar2 = *(long *)((long)&proximity[0].a + lVar10);
                        if ((paVar7->r == *(residue_t **)(lVar2 + 0x70)) &&
                           ((*(byte *)(lVar2 + 0x2a) & 4) != 0)) {
                          if (fVar19 < *(float *)((long)&proximity[0].gap + lVar10)) {
                            *(atom_t **)((long)&proximity[0].a + lVar10) = paVar7;
                            *(float *)((long)&proximity[0].gap + lVar10) = fVar19;
                          }
                          bVar4 = 0;
                          break;
                        }
                        lVar10 = lVar10 + 0x10;
                      } while ((ulong)uVar9 << 4 != lVar10);
                    }
                    if ((bool)(uVar9 < 0x14 & bVar4)) {
                      proximity[uVar9].a = paVar7;
                      proximity[uVar9].gap = fVar19;
                      uVar9 = uVar9 + 1;
                    }
                  }
                  paVar7 = paVar7->scratch;
                } while (paVar7 != (atom_t *)0x0);
              }
              paVar12 = local_200;
              paVar8 = local_1c8;
              selectedFlag = local_1f4;
              if (0 < (int)uVar9) {
                local_1e8 = &src->loc;
                local_1a0 = src->atomname;
                lVar10 = 0;
                local_1f8 = 0;
                local_1f0 = src;
                do {
                  lVar2 = *(long *)((long)&proximity[0].a + lVar10);
                  if (((*(byte *)(lVar2 + 0x2a) & 2) != 0) &&
                     (paVar8 = (atom *)malloc(0x80), paVar8 != (atom *)0x0)) {
                    paVar13 = src;
                    paVar14 = paVar8;
                    for (lVar11 = 0x10; lVar11 != 0; lVar11 = lVar11 + -1) {
                      paVar14->next = paVar13->next;
                      paVar13 = (atom *)((long)paVar13 + (ulong)bVar18 * -0x10 + 8);
                      paVar14 = (atom *)((long)paVar14 + (ulong)bVar18 * -0x10 + 8);
                    }
                    if (bVar17 && bVar16) {
                      paVar8->next = local_1d8;
                      local_1d8 = paVar8;
                    }
                    else {
                      paVar8->next = local_1f0->next;
                      local_1f0->next = paVar8;
                    }
                    v3sub((vector3d *)(lVar2 + 0x38),local_1e8,&o2aVec);
                    dVar22 = (double)*(float *)((long)&proximity[0].gap + lVar10) + 0.6;
                    newlen = (double)(~-(ulong)(dVar22 < -1.0) & 0x3ff0000000000000 |
                                     (ulong)((uint)(-(ulong)(0.0 < dVar22) >> 0x20) & 0x3ff00000 &
                                            (uint)(-(ulong)(dVar22 < -1.0) >> 0x20)) << 0x20);
                    dVar20 = newlen;
                    if (dVar22 <= 0.0) {
                      dVar20 = dVar22 + 1.0;
                    }
                    if (-1.0 <= dVar22) {
                      newlen = dVar20;
                    }
                    v3scale(&o2aVec,newlen);
                    v3add(local_1e8,&o2aVec,&paVar8->loc);
                    paVar8->nextInBin = (atom_t *)0x0;
                    paVar8->scratch = (atom_t *)0x0;
                    paVar8->elem = 5;
                    fVar19 = getRadius(5,0);
                    paVar8->radius = fVar19;
                    fVar19 = getCovRad(paVar8->elem);
                    paVar8->covRad = fVar19;
                    builtin_strncpy(paVar8->atomname," H? ",5);
                    paVar8->props = paVar8->props & 0xfffcffffU | 0x10000;
                    addNeighbor(paVar8,local_198);
                    if (DumpNewHO == '\x01') {
                      if (3 < DebugLevel) {
                        updateHydrogenInfo_cold_1();
                        local_1f8 = local_1cc;
                      }
                      __stream = local_1c0;
                      prVar3 = src->r;
                      fprintf(local_1c0,"{%4.4s%c%3.3s%s%4.4s%c}P %8.3f%8.3f%8.3f\n",(src->loc).x,
                              (src->loc).y,SUB84((src->loc).z,0),local_1a0,
                              (ulong)(uint)(int)src->altConf,prVar3->resname,prVar3->chain,
                              prVar3->Hy36resno,(ulong)(uint)(int)prVar3->resInsCode);
                      prVar3 = paVar8->r;
                      fprintf(__stream,"{%4.4s%c%3.3s%s%4s%c}L %8.3f%8.3f%8.3f\n",(paVar8->loc).x,
                              (paVar8->loc).y,paVar8->atomname,(ulong)(uint)(int)paVar8->altConf,
                              prVar3->resname,prVar3->chain,prVar3->Hy36resno,
                              (ulong)(uint)(int)prVar3->resInsCode);
                    }
                    if (!bVar17 || !bVar16) {
                      local_1f0 = local_1f0->next;
                    }
                  }
                  lVar10 = lVar10 + 0x10;
                  paVar12 = local_200;
                  paVar13 = local_1f0;
                  paVar8 = local_1c8;
                  selectedFlag = local_1f4;
                } while ((ulong)uVar9 << 4 != lVar10);
              }
            }
          }
        }
        src = paVar13->next;
      } while (src != (atom_t *)0x0);
    }
    iVar5 = (int)local_1a8;
    local_1a8 = (ulong)(iVar5 + 1);
    if (iVar5 != 0) {
      if (local_1d8 != (atom *)0x0) {
        do {
          paVar13 = paVar8;
          if (paVar13 == (atom *)0x0) {
            return local_1e0;
          }
          paVar8 = paVar13->next;
        } while (paVar13->next != (atom_t *)0x0);
        paVar13->next = local_1d8;
      }
      return local_1e0;
    }
  } while( true );
}

Assistant:

atom* updateHydrogenInfo(FILE *outf, atom *allMainAtoms,   atomBins *abins,
                    atom *allMovingAtoms, atomBins *bbins,
                    int selectedFlag, int mustSaveMainWater)
{/*updateHydrogenInfo*/
   atom *src = NULL, *orig = NULL, *atomList = NULL, *a = NULL;
   atom *newH = NULL, *tempStaticList = NULL, *mainWaterStorage = NULL;
   int type = 0, newHcount = 0, i = 0, whichList = 0;
   int nProx = 0, usesMovingAtoms = FALSE;
   int dummy = FALSE;

   /* Information specific to making sure only one H2O Hydrogen is     */
   /* generated which points into ring atoms on a given aromatic ring. */
   struct {atom  *a; float gap;} proximity[20];

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));
   if (! usesMovingAtoms) { allMovingAtoms = NULL; bbins = NULL; }

   if (DumpNewHO) { fprintf(outf,"@vectorlist {water H?} color= gray\n"); }

   tempStaticList = NULL; /* new hydrogens for MainAtoms when usesMovingAtoms */
   mainWaterStorage = NULL; /* MainAtoms waters when usesMovingAtoms          */

   for(whichList = 0; whichList <= 1; whichList++)
   { /* loop over both lists of atoms */
      for(src = ((whichList==0)?allMainAtoms:allMovingAtoms); src; src = src->next)
      {/*loop over src atoms*/

         /* Note: we have to examine ALL the atoms at this point.        */
         /* Not testing (src->flags & selectedFlag) for H will slow down */
         /* the code but it is neccessary to get the atom types correct. */

         if (isHatom(src->elem))
         { /* fixup Hs in the input */

            atomList = NULL;
            if (src->flags & selectedFlag)
            {
               atomList = findTouchingAtoms(src, NULL, abins, 0.0, 0, &dummy);
               if (usesMovingAtoms)
               {
                  atomList = findTouchingAtoms(src, atomList, bbins, 0.0, 0, &dummy);
               }
            }
            if (atomList)
            {
               markBonds(src, atomList, 1, 1); /*in updateHydrogenInfo()*/
               type = dotType(src, atomList, ByNABaseColor);

               if ( type == atomN || type == atomO || type == atomS )
               {/* bgn: if (atom types) */
                  if(Verbose && ShowTicks)
                  {
                     fprintf(stderr, "%s%d   \r",src->r->resname, src->r->resid);
                  }
                  src->props |= DONOR_PROP; /* polar hydrogens are donors */

                  if (UsePolarH)
                  {
                     src->elem = atomHpolar; /* very important */
                     src->radius = getRadius(src->elem, 0);
                  }
/* there are a more restrictive set of cutoffs in reduce: 0.7 & 40 */
#define H2OoccCUTTOFF   0.25
#define H2ObvalCUTTOFF 80.0
                  if (  (   FABS(src->occ) < H2OoccCUTTOFF
                         || src->bval >= H2ObvalCUTTOFF   )
                      &&(src->props & WATER_PROP)          )
                  {
                     src->elem = ignoreAtom;
                     src->radius = 0.0;
                  } /* ignore low occupancy High B water hydrogens */

                  for(a = atomList; a; a = a->scratch)
                  {
                     /* since we found a hydrogen, then we know */
                     /* that the heavy atom is not the donor    */
                     /* so we can disable that property         */
                     if(    (a->mark == 1)
                        && !(isHatom(a->elem))
                        &&  (FABS(src->occ) >= H2OoccCUTTOFF)
                        &&  (src->bval < H2ObvalCUTTOFF)     )
                     {

                        a->props &= ~DONOR_PROP; /*set to one's complement of ...*/
                     }
                  }
               }/* end: if (atom types) */
            }
         }/* fixup Hs in the input */
         else if (   (src->flags & selectedFlag)  /* fixup water oxygen */
                  && (src->props & WATER_PROP)
                  && (src->elem == atomO)       )
         {/* else if water */ /* fixup water oxygen */

            /*if connected H already found, the DONOR prop will not be set*/
            /*if it is, we look further ahead in this residue for Hs      */
            if (src->props & DONOR_PROP)
            {
               for(a = src->next; a && (src->r == a->r); a = a->next)
               {
                  if (  isHatom(a->elem)
                      && (src->altConf == a->altConf)
                      && (a->occ > 0.1))
                  {
                     src->props &= ~DONOR_PROP; /* turn off donor property */
                  }
               }
            }
            /* if donor flag still set...  */
            if (src->props & DONOR_PROP)
            {/* water O without occupied Hs */

               /* begin clone procedure */
               /* special case for when we want to remember just these waters */
               /* in this state                                               */
               if (mustSaveMainWater && usesMovingAtoms && (whichList==0))
               {
                  atom* waterClone = NULL;
                  waterClone = (atom *)malloc(sizeof(atom));
                  if (waterClone)
                  {
                     *waterClone = *src;
                     waterClone->next = mainWaterStorage; /* add clone to list */
                     mainWaterStorage = waterClone;
                  }
               }
               /* end clone procedure */

               src->props |= AMBIGWATER_PROP; /* this is a water which needs H? added */
               src->props |=  ACCEPTOR_PROP;
               src->props &= ~DONOR_PROP;    /* acceptor, not donor */
               orig = src; /* keep track of the original Oxygen atom */
               atomList = findTouchingAtoms(src, NULL, abins, 0.25, 0, &dummy);
               if (usesMovingAtoms)
               {
                  atomList = findTouchingAtoms(src, atomList, bbins, 0.25, 0, &dummy);
               }
               /* the 0.25 comes from:
                  OxygenVDW(1.4) + 2*probeRad(0.3) == HpolVDW(1.0) + OHBondLen(1.0)
                  and we want a minimum overlap of 0.1 before we consider possible Hs
               */

              /* for each nearby HB acceptor, keep only 1 per aromatic ring */
              nProx = 0;
              for(a = atomList; a; a = a->scratch)
              {
                 if (a->props & ACCEPTOR_PROP)
                 {/* bgn: if acceptor_prop */
                    float hbgap = gapSize(&(a->loc), &(orig->loc), a->radius + 2.0f);
                    int   foundAromRingAtom = FALSE;

                    if (a->props & AROMATIC_PROP)
                    {
                       for (i=0; i < nProx; i++)
                       {
                          if (   a->r == proximity[i].a->r
                              && proximity[i].a->props & AROMATIC_PROP)
                          {

                             if (hbgap < proximity[i].gap)
                             {
                                proximity[i].a = a;
                                proximity[i].gap = hbgap;
                             }
                             foundAromRingAtom = TRUE;
                             break;
                          }
                       }
                    }
                    if (   (!foundAromRingAtom)
                        && nProx < sizeof(proximity)/sizeof(proximity[0]))
                    {
                       proximity[nProx].a = a;
                       proximity[nProx].gap  = hbgap;
                       ++nProx;
                    }
                 }/* end: if acceptor_prop */
              }

              /* build new HOH hydrogens in the direction of each acceptor */
              newHcount = 0;
              for (i=0; i < nProx; i++)
              {/*scan over neighbors*/

                 a = proximity[i].a;

                 if (a->props & ACCEPTOR_PROP)
                 {/*close acceptor! Make a phantom H in the direction of each Acceptor*/
                    newH = (atom *)malloc(sizeof(atom));
                    if (newH)
                    {/*newH allocated, set its parameters*/
                       point3d o2aVec;
                       double waterOHbondLen;

                       *newH = *orig;
                       if (usesMovingAtoms)
                       {
                          newH->next = tempStaticList; /* hook into temp list */
                          tempStaticList = newH;
                       }
                       else
                       {
                          newH->next = src->next; /* hook into list of atoms */
                          src->next  = newH;
                       }

                       v3sub(&(a->loc), &(orig->loc), &o2aVec);
#define BEST_HBOND_OVERLAP 0.6
                       waterOHbondLen = 1.0 +
                       MAX(-1.0, MIN(0.0, proximity[i].gap + BEST_HBOND_OVERLAP));
                       v3scale(&o2aVec, waterOHbondLen);
                       v3add(&(orig->loc), &o2aVec, &(newH->loc));

                       newH->nextInBin= NULL; /* added to bins below */
                       newH->scratch  = NULL;
                       newH->elem     = atomHOd; /*hb-only-dummy, phantom H atom*/
                       newH->radius   = getRadius(newH->elem, 0);
                       newH->covRad   = getCovRad(newH->elem);
                          /*atomprops.h/atomProp AtomTbl covRad*/
                       strcpy(newH->atomname, " H? ");

                       newH->props |=  DONOR_PROP;
                       newH->props &= ~ACCEPTOR_PROP; /* donor, not acceptor */

                       /* *** adding an atom not in input! *** */
                       addNeighbor(newH, (usesMovingAtoms ? bbins : abins));

                       if (DumpNewHO)
                       {
                          if (DebugLevel>3)
                          {
                             fprintf(stderr,
"HETATM%5d  H%-2d%c%3.3s%s%4.4s%c   %8.3f%8.3f%8.3f%6.2f%6.2f      new  H\n",
                                0, ++newHcount, newH->altConf,
                                newH->r->resname, newH->r->chain,
                                newH->r->Hy36resno, newH->r->resInsCode,
                                newH->loc.x, newH->loc.y, newH->loc.z,
                                newH->occ, newH->bval);
                          }
                          fprintf(outf, "{%4.4s%c%3.3s%s%4.4s%c}P %8.3f%8.3f%8.3f\n",
                             orig->atomname, orig->altConf,
                             orig->r->resname, orig->r->chain,
                             orig->r->Hy36resno, orig->r->resInsCode,
                             orig->loc.x, orig->loc.y, orig->loc.z);
                          fprintf(outf, "{%4.4s%c%3.3s%s%4s%c}L %8.3f%8.3f%8.3f\n",
                             newH->atomname, newH->altConf,
                             newH->r->resname, newH->r->chain,
                             newH->r->Hy36resno, newH->r->resInsCode,
                             newH->loc.x, newH->loc.y, newH->loc.z);
                       }

                       if (! usesMovingAtoms)
                       {
                          src = src->next; /* bypass new atom when we iterate */
                                           /* when inserted after src atom    */
                       }
                    }/*newH allocated, set its parameters*/
                 }/*close acceptor! Make a phantom H in the direction of each Acceptor*/
              }/*scan over neighbors*/

            }/* water O without occupied Hs */
         }/* else if water */ /* fixup water oxygen */

         /* non-water polar (N/O/S) atoms in selection list */
         else if (    (src->flags & selectedFlag) && !(src->props & WATER_PROP)
                  &&  (src->elem == atomN || src->elem == atomO || src->elem == atomS))
         {
            /* Remove any DONOR property for non-water non-H            */
            /* polar atoms since the Hydrogen atoms will be the DONORs. */
            /* This was assigned in select.c to facilitate selections.  */

            src->props &= ~DONOR_PROP;
         }
      }/*loop over src atoms */ /* end loop over list of src atoms*/
   }/* loop over both lists of atoms */

   if (tempStaticList)
   {/* new hydrogens for MainAtoms when usesMovingAtoms */
      for(src = allMovingAtoms; src; src = src->next)
      {
         if (src->next == NULL)
         {
            src->next = tempStaticList;
            break; /* make sure we don't continually loop */
         }
      }
   }
   return mainWaterStorage;
}